

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O1

cmCPackComponent * __thiscall
cmCPackGenerator::GetComponent(cmCPackGenerator *this,string *projectName,string *name)

{
  pointer *pppcVar1;
  char *pcVar2;
  cmCPackComponentGroup *pcVar3;
  iterator iVar4;
  iterator __position;
  undefined8 uVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  const_iterator cVar9;
  long *plVar10;
  char *pcVar11;
  size_t sVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  size_type *psVar13;
  string *psVar14;
  long lVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  cmCPackComponent *component;
  string macroPrefix;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  installTypesVector;
  undefined1 local_b0 [16];
  undefined1 local_a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  _Alloc_hider local_80;
  size_type local_78;
  undefined1 auStack_70 [16];
  cmCPackComponentGroup *pcStack_60;
  undefined8 local_58;
  string local_50;
  
  cVar9 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
          ::find(&(this->Components)._M_t,name);
  local_90._M_allocated_capacity =
       (size_type)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
       ::operator[](&this->Components,name);
  if ((_Rb_tree_header *)cVar9._M_node == &(this->Components)._M_t._M_impl.super__Rb_tree_header) {
    cmsys::SystemTools::UpperCase((string *)local_b0,name);
    plVar10 = (long *)std::__cxx11::string::replace((ulong)local_b0,0,(char *)0x0,0x4fdc33);
    local_90._8_8_ = local_a0 + 0x28;
    psVar13 = (size_type *)(plVar10 + 2);
    if ((size_type *)*plVar10 == psVar13) {
      local_78 = *psVar13;
      auStack_70._0_8_ = plVar10[3];
    }
    else {
      local_78 = *psVar13;
      local_90._8_8_ = (size_type *)*plVar10;
    }
    local_80._M_p = (pointer)plVar10[1];
    *plVar10 = (long)psVar13;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    if ((undefined1 *)local_b0._0_8_ != local_a0) {
      operator_delete((void *)local_b0._0_8_,local_a0._0_8_ + 1);
    }
    std::__cxx11::string::_M_assign((string *)local_90._M_allocated_capacity);
    local_b0._0_8_ = local_a0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_b0,local_90._8_8_,local_80._M_p + local_90._8_8_);
    std::__cxx11::string::append(local_b0);
    pcVar11 = GetOption(this,(string *)local_b0);
    if ((undefined1 *)local_b0._0_8_ != local_a0) {
      operator_delete((void *)local_b0._0_8_,local_a0._0_8_ + 1);
    }
    if ((pcVar11 == (char *)0x0) || (*pcVar11 == '\0')) {
      std::__cxx11::string::_M_assign((string *)(local_90._M_allocated_capacity + 0x20));
    }
    else {
      pcVar2 = *(char **)(local_90._M_allocated_capacity + 0x28);
      psVar14 = (string *)(local_90._M_allocated_capacity + 0x20);
      strlen(pcVar11);
      std::__cxx11::string::_M_replace((ulong)psVar14,0,pcVar2,(ulong)pcVar11);
    }
    local_b0._0_8_ = local_a0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_b0,local_90._8_8_,local_80._M_p + local_90._8_8_);
    std::__cxx11::string::append(local_b0);
    pcVar11 = GetOption(this,(string *)local_b0);
    bVar6 = cmSystemTools::IsOn(pcVar11);
    *(byte *)(local_90._M_allocated_capacity + 0x48) =
         *(byte *)(local_90._M_allocated_capacity + 0x48) & 0xfd | bVar6 * '\x02';
    if ((undefined1 *)local_b0._0_8_ != local_a0) {
      operator_delete((void *)local_b0._0_8_,local_a0._0_8_ + 1);
    }
    local_b0._0_8_ = local_a0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_b0,local_90._8_8_,local_80._M_p + local_90._8_8_);
    std::__cxx11::string::append(local_b0);
    pcVar11 = GetOption(this,(string *)local_b0);
    bVar6 = cmSystemTools::IsOn(pcVar11);
    *(byte *)(local_90._M_allocated_capacity + 0x48) =
         *(byte *)(local_90._M_allocated_capacity + 0x48) & 0xfe | bVar6;
    if ((undefined1 *)local_b0._0_8_ != local_a0) {
      operator_delete((void *)local_b0._0_8_,local_a0._0_8_ + 1);
    }
    local_b0._0_8_ = local_a0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_b0,local_90._8_8_,local_80._M_p + local_90._8_8_);
    std::__cxx11::string::append(local_b0);
    pcVar11 = GetOption(this,(string *)local_b0);
    bVar6 = cmSystemTools::IsOn(pcVar11);
    *(byte *)(local_90._M_allocated_capacity + 0x48) =
         *(byte *)(local_90._M_allocated_capacity + 0x48) & 0xfb | bVar6 << 2;
    if ((undefined1 *)local_b0._0_8_ != local_a0) {
      operator_delete((void *)local_b0._0_8_,local_a0._0_8_ + 1);
    }
    local_b0._0_8_ = local_a0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_b0,local_90._8_8_,local_80._M_p + local_90._8_8_);
    std::__cxx11::string::append(local_b0);
    pcVar11 = GetOption(this,(string *)local_b0);
    bVar6 = cmSystemTools::IsOn(pcVar11);
    if (bVar6) {
      *(byte *)(local_90._M_allocated_capacity + 0x48) =
           *(byte *)(local_90._M_allocated_capacity + 0x48) | 8;
    }
    else {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"CPACK_DOWNLOAD_ALL","");
      pcVar11 = GetOption(this,&local_50);
      bVar7 = cmSystemTools::IsOn(pcVar11);
      *(byte *)(local_90._M_allocated_capacity + 0x48) =
           *(byte *)(local_90._M_allocated_capacity + 0x48) & 0xf7 | bVar7 << 3;
      if ((!bVar6) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2)) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    if ((undefined1 *)local_b0._0_8_ != local_a0) {
      operator_delete((void *)local_b0._0_8_,local_a0._0_8_ + 1);
    }
    local_b0._0_8_ = local_a0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_b0,local_90._8_8_,local_80._M_p + local_90._8_8_);
    std::__cxx11::string::append(local_b0);
    pcVar11 = GetOption(this,(string *)local_b0);
    if ((undefined1 *)local_b0._0_8_ != local_a0) {
      operator_delete((void *)local_b0._0_8_,local_a0._0_8_ + 1);
    }
    if ((pcVar11 != (char *)0x0) && (*pcVar11 != '\0')) {
      pcVar2 = *(char **)(local_90._M_allocated_capacity + 0x90);
      psVar14 = (string *)(local_90._M_allocated_capacity + 0x88);
      strlen(pcVar11);
      std::__cxx11::string::_M_replace((ulong)psVar14,0,pcVar2,(ulong)pcVar11);
    }
    local_b0._0_8_ = local_a0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_b0,local_90._8_8_,local_80._M_p + local_90._8_8_);
    std::__cxx11::string::append(local_b0);
    pcVar11 = GetOption(this,(string *)local_b0);
    if ((undefined1 *)local_b0._0_8_ != local_a0) {
      operator_delete((void *)local_b0._0_8_,local_a0._0_8_ + 1);
    }
    if ((pcVar11 == (char *)0x0) || (*pcVar11 == '\0')) {
      *(cmCPackComponentGroup **)(local_90._M_allocated_capacity + 0x40) =
           (cmCPackComponentGroup *)0x0;
    }
    else {
      local_b0._0_8_ = local_a0;
      sVar12 = strlen(pcVar11);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,pcVar11,pcVar11 + sVar12);
      iVar8 = (*(this->super_cmObject)._vptr_cmObject[0x1b])(this,projectName,local_b0);
      *(cmCPackComponentGroup **)(local_90._M_allocated_capacity + 0x40) =
           (cmCPackComponentGroup *)CONCAT44(extraout_var,iVar8);
      if ((undefined1 *)local_b0._0_8_ != local_a0) {
        operator_delete((void *)local_b0._0_8_,local_a0._0_8_ + 1);
      }
      pcVar3 = *(cmCPackComponentGroup **)(local_90._M_allocated_capacity + 0x40);
      iVar4._M_current =
           (pcVar3->Components).
           super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (pcVar3->Components).
          super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<cmCPackComponent*,std::allocator<cmCPackComponent*>>::
        _M_realloc_insert<cmCPackComponent*const&>
                  ((vector<cmCPackComponent*,std::allocator<cmCPackComponent*>> *)
                   &pcVar3->Components,iVar4,(cmCPackComponent **)(local_a0 + 0x10));
      }
      else {
        *iVar4._M_current = (cmCPackComponent *)local_90._M_allocated_capacity;
        pppcVar1 = &(pcVar3->Components).
                    super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppcVar1 = *pppcVar1 + 1;
      }
    }
    local_b0._0_8_ = local_a0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_b0,local_90._8_8_,local_80._M_p + local_90._8_8_);
    std::__cxx11::string::append(local_b0);
    pcVar11 = GetOption(this,(string *)local_b0);
    if ((undefined1 *)local_b0._0_8_ != local_a0) {
      operator_delete((void *)local_b0._0_8_,local_a0._0_8_ + 1);
    }
    if ((pcVar11 != (char *)0x0) && (*pcVar11 != '\0')) {
      pcVar2 = *(char **)(local_90._M_allocated_capacity + 0x58);
      psVar14 = (string *)(local_90._M_allocated_capacity + 0x50);
      strlen(pcVar11);
      std::__cxx11::string::_M_replace((ulong)psVar14,0,pcVar2,(ulong)pcVar11);
    }
    local_b0._0_8_ = (cmCPackInstallationType *)local_a0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_b0,local_90._8_8_,local_80._M_p + local_90._8_8_);
    std::__cxx11::string::append(local_b0);
    pcVar11 = GetOption(this,(string *)local_b0);
    if ((cmCPackInstallationType *)local_b0._0_8_ != (cmCPackInstallationType *)local_a0) {
      operator_delete((void *)local_b0._0_8_,local_a0._0_8_ + 1);
    }
    if ((pcVar11 != (char *)0x0) && (*pcVar11 != '\0')) {
      auStack_70._8_8_ = 0;
      pcStack_60 = (cmCPackComponentGroup *)0x0;
      local_58 = 0;
      local_b0._0_8_ = (cmCPackInstallationType *)local_a0;
      sVar12 = strlen(pcVar11);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,pcVar11,pcVar11 + sVar12);
      cmSystemTools::ExpandListArgument
                ((string *)local_b0,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(local_a0 + 0x38),false);
      if ((cmCPackInstallationType *)local_b0._0_8_ != (cmCPackInstallationType *)local_a0) {
        operator_delete((void *)local_b0._0_8_,local_a0._0_8_ + 1);
      }
      if ((cmCPackComponentGroup *)auStack_70._8_8_ != pcStack_60) {
        lVar15 = auStack_70._8_8_;
        do {
          uVar5 = local_90._M_allocated_capacity;
          iVar8 = (*(this->super_cmObject)._vptr_cmObject[0x19])(this,projectName,lVar15);
          local_b0._0_8_ = CONCAT44(extraout_var_00,iVar8);
          __position._M_current = *(pointer *)(uVar5 + 0x78);
          if (__position._M_current == *(pointer *)(uVar5 + 0x80)) {
            std::vector<cmCPackInstallationType*,std::allocator<cmCPackInstallationType*>>::
            _M_realloc_insert<cmCPackInstallationType*>
                      ((vector<cmCPackInstallationType*,std::allocator<cmCPackInstallationType*>> *)
                       (uVar5 + 0x70),__position,(cmCPackInstallationType **)local_b0);
          }
          else {
            *__position._M_current = (cmCPackInstallationType *)local_b0._0_8_;
            *(pointer *)(uVar5 + 0x78) = *(pointer *)(uVar5 + 0x78) + 1;
          }
          lVar15 = lVar15 + 0x20;
        } while ((cmCPackComponentGroup *)lVar15 != pcStack_60);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_a0 + 0x38));
    }
    local_b0._0_8_ = (cmCPackComponent *)local_a0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_b0,local_90._8_8_,local_80._M_p + local_90._8_8_);
    std::__cxx11::string::append(local_b0);
    pcVar11 = GetOption(this,(string *)local_b0);
    if ((cmCPackComponent *)local_b0._0_8_ != (cmCPackComponent *)local_a0) {
      operator_delete((void *)local_b0._0_8_,local_a0._0_8_ + 1);
    }
    if ((pcVar11 != (char *)0x0) && (*pcVar11 != '\0')) {
      auStack_70._8_8_ = 0;
      pcStack_60 = (cmCPackComponentGroup *)0x0;
      local_58 = 0;
      local_b0._0_8_ = (cmCPackComponent *)local_a0;
      sVar12 = strlen(pcVar11);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,pcVar11,pcVar11 + sVar12);
      cmSystemTools::ExpandListArgument
                ((string *)local_b0,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(local_a0 + 0x38),false);
      if ((cmCPackComponent *)local_b0._0_8_ != (cmCPackComponent *)local_a0) {
        operator_delete((void *)local_b0._0_8_,local_a0._0_8_ + 1);
      }
      if ((cmCPackComponentGroup *)auStack_70._8_8_ != pcStack_60) {
        lVar15 = auStack_70._8_8_;
        do {
          iVar8 = (*(this->super_cmObject)._vptr_cmObject[0x1a])(this,projectName,lVar15);
          local_b0._0_8_ = CONCAT44(extraout_var_01,iVar8);
          iVar4._M_current = *(pointer *)(local_90._M_allocated_capacity + 0xb0);
          if (iVar4._M_current == *(pointer *)(local_90._M_allocated_capacity + 0xb8)) {
            std::vector<cmCPackComponent*,std::allocator<cmCPackComponent*>>::
            _M_realloc_insert<cmCPackComponent*const&>
                      ((vector<cmCPackComponent*,std::allocator<cmCPackComponent*>> *)
                       (local_90._M_allocated_capacity + 0xa8),iVar4,(cmCPackComponent **)local_b0);
          }
          else {
            *iVar4._M_current = (cmCPackComponent *)local_b0._0_8_;
            *(pointer *)(local_90._M_allocated_capacity + 0xb0) =
                 *(pointer *)(local_90._M_allocated_capacity + 0xb0) + 1;
          }
          iVar4._M_current = *(pointer *)(local_b0._0_8_ + 200);
          if (iVar4._M_current == *(pointer *)(local_b0._0_8_ + 0xd0)) {
            std::vector<cmCPackComponent*,std::allocator<cmCPackComponent*>>::
            _M_realloc_insert<cmCPackComponent*const&>
                      ((vector<cmCPackComponent*,std::allocator<cmCPackComponent*>> *)
                       (local_b0._0_8_ + 0xc0),iVar4,(cmCPackComponent **)(local_a0 + 0x10));
          }
          else {
            *iVar4._M_current = (cmCPackComponent *)local_90._M_allocated_capacity;
            *(pointer *)(local_b0._0_8_ + 200) = *(pointer *)(local_b0._0_8_ + 200) + 1;
          }
          lVar15 = lVar15 + 0x20;
        } while ((cmCPackComponentGroup *)lVar15 != pcStack_60);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_a0 + 0x38));
    }
    if ((undefined1 *)local_90._8_8_ != local_a0 + 0x28) {
      operator_delete((void *)local_90._8_8_,local_78 + 1);
    }
  }
  return (cmCPackComponent *)local_90._M_allocated_capacity;
}

Assistant:

cmCPackComponent*
cmCPackGenerator::GetComponent(const std::string& projectName,
                               const std::string& name)
{
  bool hasComponent = this->Components.count(name) != 0;
  cmCPackComponent *component = &this->Components[name];
  if (!hasComponent)
    {
    // Define the component
    std::string macroPrefix = "CPACK_COMPONENT_"
      + cmsys::SystemTools::UpperCase(name);
    component->Name = name;
    const char* displayName
      = this->GetOption(macroPrefix + "_DISPLAY_NAME");
    if (displayName && *displayName)
      {
      component->DisplayName = displayName;
      }
    else
      {
      component->DisplayName = component->Name;
      }
    component->IsHidden
      = this->IsOn(macroPrefix + "_HIDDEN");
    component->IsRequired
      = this->IsOn(macroPrefix + "_REQUIRED");
    component->IsDisabledByDefault
      = this->IsOn(macroPrefix + "_DISABLED");
    component->IsDownloaded
      = this->IsOn(macroPrefix + "_DOWNLOADED")
        || cmSystemTools::IsOn(this->GetOption("CPACK_DOWNLOAD_ALL"));

    const char* archiveFile = this->GetOption(macroPrefix +
                                               "_ARCHIVE_FILE");
    if (archiveFile && *archiveFile)
      {
      component->ArchiveFile = archiveFile;
      }

    const char* groupName = this->GetOption(macroPrefix + "_GROUP");
    if (groupName && *groupName)
      {
      component->Group = GetComponentGroup(projectName, groupName);
      component->Group->Components.push_back(component);
      }
    else
      {
      component->Group = 0;
      }

    const char* description
      = this->GetOption(macroPrefix + "_DESCRIPTION");
    if (description && *description)
      {
      component->Description = description;
      }

    // Determine the installation types.
    const char *installTypes
      = this->GetOption(macroPrefix + "_INSTALL_TYPES");
    if (installTypes && *installTypes)
      {
      std::vector<std::string> installTypesVector;
      cmSystemTools::ExpandListArgument(installTypes, installTypesVector);
      std::vector<std::string>::iterator installTypesIt;
      for (installTypesIt = installTypesVector.begin();
           installTypesIt != installTypesVector.end();
           ++installTypesIt)
        {
        component->InstallationTypes.push_back(
          this->GetInstallationType(projectName, *installTypesIt));
        }
      }

    // Determine the component dependencies.
    const char *depends = this->GetOption(macroPrefix + "_DEPENDS");
    if (depends && *depends)
      {
      std::vector<std::string> dependsVector;
      cmSystemTools::ExpandListArgument(depends, dependsVector);
      std::vector<std::string>::iterator dependIt;
      for (dependIt = dependsVector.begin();
           dependIt != dependsVector.end();
           ++dependIt)
        {
        cmCPackComponent *child = GetComponent(projectName,
                                               *dependIt);
        component->Dependencies.push_back(child);
        child->ReverseDependencies.push_back(component);
        }
      }
    }
  return component;
}